

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_fixup(CompilerGLSL *this)

{
  bool bVar1;
  char *local_18;
  char *suffix;
  CompilerGLSL *this_local;
  
  suffix = (char *)this;
  bVar1 = Compiler::is_vertex_like_shader(&this->super_Compiler);
  if (bVar1) {
    if (((this->options).vertex.fixup_clipspace & 1U) != 0) {
      local_18 = "\x05\x05\x04";
      if (((this->backend).float_literal_suffix & 1U) != 0) {
        local_18 = "0.0f";
      }
      local_18 = local_18 + 3;
      statement<char_const(&)[20],char_const*&,char_const(&)[34]>
                (this,(char (*) [20])"gl_Position.z = 2.0",&local_18,
                 (char (*) [34])" * gl_Position.z - gl_Position.w;");
    }
    if (((this->options).vertex.flip_vert_y & 1U) != 0) {
      statement<char_const(&)[32]>(this,(char (*) [32])"gl_Position.y = -gl_Position.y;");
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_fixup()
{
	if (is_vertex_like_shader())
	{
		if (options.vertex.fixup_clipspace)
		{
			const char *suffix = backend.float_literal_suffix ? "f" : "";
			statement("gl_Position.z = 2.0", suffix, " * gl_Position.z - gl_Position.w;");
		}

		if (options.vertex.flip_vert_y)
			statement("gl_Position.y = -gl_Position.y;");
	}
}